

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_parse_same_option_twice_string_with_unique(void)

{
  int iVar1;
  uint uVar2;
  char *local_78;
  char *args [7];
  undefined1 local_34 [4];
  long lStack_30;
  int i;
  char *s;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  cargo._4_4_ = 0;
  iVar1 = cargo_init((cargo_t *)&s,0,"program");
  if (iVar1 == 0) {
    lStack_30 = 0;
    memcpy(&local_78,&DAT_0013e420,0x38);
    uVar2 = cargo_add_option((cargo_t)s,CARGO_OPT_UNIQUE,"--alpha -a","The alpha","s",
                             &stack0xffffffffffffffd0);
    cargo._4_4_ = uVar2 | cargo._4_4_;
    uVar2 = cargo_add_option((cargo_t)s,0,"--beta -b","The beta","i",local_34);
    cargo._4_4_ = uVar2 | cargo._4_4_;
    if (cargo._4_4_ == 0) {
      cargo._4_4_ = cargo_parse((cargo_t)s,0,1,7,&local_78);
      printf("--alpha = %s\n",lStack_30);
      if (cargo._4_4_ == 0) {
        pcStack_18 = "Succesfully parsed duplicate option";
      }
      else if (lStack_30 != 0) {
        pcStack_18 = "Expected --alpha to have value NULL";
      }
    }
    else {
      pcStack_18 = "Failed to add options";
    }
    _cargo_xfree(&stack0xffffffffffffffd0);
    cargo_destroy((cargo_t *)&s);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_parse_same_option_twice_string_with_unique)
{
    char *s = NULL;
    int i;
    char *args[] = { "program", "--alpha", "abc", "--beta", "4", "--alpha", "def" };

    ret |= cargo_add_option(cargo, CARGO_OPT_UNIQUE,
                            "--alpha -a", "The alpha", "s", &s);
    ret |= cargo_add_option(cargo, 0, "--beta -b", "The beta", "i", &i);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    printf("--alpha = %s\n", s);
    cargo_assert(ret != 0, "Succesfully parsed duplicate option");
    cargo_assert(s == NULL, "Expected --alpha to have value NULL");

    _TEST_CLEANUP();
    _cargo_xfree(&s);
}